

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * random_id_abi_cxx11_(int len)

{
  char *pcVar1;
  result_type_conflict1 rVar2;
  int in_ESI;
  undefined4 in_register_0000003c;
  ulong uVar3;
  allocator local_2752;
  undefined1 local_2751;
  int local_2750;
  result_type local_274c;
  int i;
  int rand_idx;
  char *s;
  uniform_int_distribution<int> dis;
  undefined1 local_2728 [8];
  mt19937 gen;
  random_device rd;
  int len_local;
  string *retval;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar2 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2728,(ulong)rVar2);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)((long)&s + 4),0,0x3d);
  uVar3 = (ulong)(in_ESI + 1);
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  _i = (char *)operator_new__(uVar3);
  for (local_2750 = 0; pcVar1 = _i, local_2750 < in_ESI; local_2750 = local_2750 + 1) {
    local_274c = std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)((long)&s + 4),
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2728);
    _i[local_2750] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[local_274c];
  }
  _i[in_ESI] = '\0';
  local_2751 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)CONCAT44(in_register_0000003c,len),pcVar1,&local_2752);
  std::allocator<char>::~allocator((allocator<char> *)&local_2752);
  if (_i != (char *)0x0) {
    operator_delete__(_i);
  }
  local_2751 = 1;
  std::random_device::~random_device((random_device *)&gen._M_p);
  return (string *)CONCAT44(in_register_0000003c,len);
}

Assistant:

string random_id(const int len) {
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, alphanumlen - 1);

    auto *s = new char[len + 1];
    int rand_idx;
    for (int i = 0; i < len; ++i) {
        rand_idx = dis(gen);
        s[i] = alphanum[rand_idx];
    }
    s[len] = 0;
    string retval(s);
    delete [] s;
    return retval;
}